

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O0

UnicodeString * icu_63::LocaleUtility::initNameFromLocale(Locale *locale,UnicodeString *result)

{
  UnicodeString *this;
  UBool UVar1;
  char *src;
  UnicodeString local_58;
  UnicodeString *local_18;
  UnicodeString *result_local;
  Locale *locale_local;
  
  local_18 = result;
  result_local = (UnicodeString *)locale;
  UVar1 = Locale::isBogus(locale);
  this = local_18;
  if (UVar1 == '\0') {
    src = Locale::getName((Locale *)result_local);
    UnicodeString::UnicodeString(&local_58,src,-1,kInvariant);
    UnicodeString::append(this,&local_58);
    UnicodeString::~UnicodeString(&local_58);
  }
  else {
    UnicodeString::setToBogus(local_18);
  }
  return local_18;
}

Assistant:

UnicodeString&
LocaleUtility::initNameFromLocale(const Locale& locale, UnicodeString& result)
{
    if (locale.isBogus()) {
        result.setToBogus();
    } else {
        result.append(UnicodeString(locale.getName(), -1, US_INV));
    }
    return result;
}